

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall node::anon_unknown_2::NodeImpl::getNetworkActive(NodeImpl *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
                     CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  local_11 = false;
  if (bVar2) {
    std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::operator->
              ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)
               CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    local_11 = CConnman::GetNetworkActive
                         ((CConnman *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8))
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool getNetworkActive() override { return m_context->connman && m_context->connman->GetNetworkActive(); }